

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxExtensions.cpp
# Opt level: O1

int sfglx_LoadFunctions(Display *display,int screen)

{
  byte bVar1;
  long *__s1;
  int iVar2;
  byte *pbVar3;
  long lVar4;
  undefined4 in_register_00000034;
  byte *pbVar5;
  long *local_50 [2];
  long local_40 [2];
  
  sfglx_ext_EXT_swap_control = 0;
  sfglx_ext_MESA_swap_control = 0;
  sfglx_ext_SGI_swap_control = 0;
  sfglx_ext_EXT_framebuffer_sRGB = 0;
  sfglx_ext_ARB_framebuffer_sRGB = 0;
  sfglx_ext_ARB_multisample = 0;
  sfglx_ext_SGIX_pbuffer = 0;
  sfglx_ext_ARB_create_context = 0;
  sfglx_ext_ARB_create_context_profile = 0;
  pbVar3 = (byte *)glXQueryExtensionsString(display,CONCAT44(in_register_00000034,screen));
  pbVar5 = pbVar3;
  do {
    for (; (*pbVar5 & 0xdf) != 0; pbVar5 = pbVar5 + 1) {
    }
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pbVar3,pbVar5);
    __s1 = local_50[0];
    lVar4 = 0;
    do {
      iVar2 = strcmp((char *)__s1,*(char **)((long)&ExtensionMap[0].extensionName + lVar4));
      if (iVar2 == 0) {
        lVar4 = (long)&ExtensionMap[0].extensionName + lVar4;
        goto LAB_00146a56;
      }
      lVar4 = lVar4 + 0x18;
    } while ((int)lVar4 != 0xd8);
    lVar4 = 0;
LAB_00146a56:
    if (lVar4 != 0) {
      if (*(code **)(lVar4 + 0x10) == (code *)0x0) {
        iVar2 = 1;
      }
      else {
        iVar2 = (**(code **)(lVar4 + 0x10))();
        iVar2 = iVar2 + 1;
      }
      **(int **)(lVar4 + 8) = iVar2;
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    pbVar3 = pbVar5 + 1;
    bVar1 = *pbVar5;
    pbVar5 = pbVar3;
    if (bVar1 == 0) {
      return 1;
    }
  } while( true );
}

Assistant:

int sfglx_LoadFunctions(Display* display, int screen)
{
    ClearExtensionVars();


    ProcExtsFromExtString(reinterpret_cast<const char*>(glXQueryExtensionsString(display, screen)));
    return sfglx_LOAD_SUCCEEDED;
}